

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void getSymbol(void)

{
  int iVar1;
  char *pcVar2;
  
LAB_001048f3:
  currentSymbol = 0;
  if (currentCharacter < '!' && terminate == 0) {
    do {
      getCharacter();
      if (terminate != 0) break;
    } while (currentCharacter < '!');
  }
  if (terminate == 1) {
    currentSymbol = -2;
    return;
  }
  if ((byte)currentCharacter < 0x5b) {
    switch(currentCharacter) {
    case '!':
      getCharacter();
      if (currentCharacter == '=') {
        currentSymbol = 0x69;
        break;
      }
      goto LAB_00104bd7;
    default:
      goto switchD_0010495a_caseD_22;
    case '#':
      getCharacter();
      iVar1 = handleIdentifier();
      if (iVar1 == 0x270) {
        currentSymbol = 0x271;
        return;
      }
      pcVar2 = "bad include";
      goto LAB_00104c80;
    case '%':
      currentSymbol = 0x6c;
      break;
    case '&':
      getCharacter();
      if (currentCharacter == '&') {
        currentSymbol = 0xca;
        break;
      }
      pcVar2 = "error in logic and";
LAB_00104bd2:
      mark(pcVar2);
      goto LAB_00104bd7;
    case '(':
      currentSymbol = 0x12d;
      break;
    case ')':
      currentSymbol = 0x12e;
      break;
    case '*':
      currentSymbol = 99;
      break;
    case '+':
      currentSymbol = 0x61;
      break;
    case '-':
      currentSymbol = 0x62;
      getCharacter();
      if (currentCharacter != '>') {
        return;
      }
      currentSymbol = 0xcd;
      break;
    case '.':
      getCharacter();
      currentSymbol = 0x272;
      return;
    case '/':
      currentSymbol = 100;
      getCharacter();
      if (currentCharacter != '*') {
        return;
      }
      do {
        getCharacter();
      } while (currentCharacter != '*');
      getCharacter();
      if (currentCharacter == '/') goto code_r0x00104998;
      pcVar2 = "bad termination of comment";
LAB_00104c80:
      mark(pcVar2);
LAB_00104c85:
      exit(-1);
    case '<':
      currentSymbol = 0x6a;
      getCharacter();
      if (currentCharacter != '=') {
        return;
      }
      currentSymbol = 0x67;
      break;
    case '=':
      currentSymbol = 0x65;
      getCharacter();
      if (currentCharacter != '=') {
        return;
      }
      currentSymbol = 0x66;
      break;
    case '>':
      currentSymbol = 0x6b;
      getCharacter();
      if (currentCharacter != '=') {
        return;
      }
      currentSymbol = 0x68;
    }
  }
  else {
    if ((byte)currentCharacter < 0x7b) {
      if (currentCharacter == '[') {
        currentSymbol = 0x130;
        goto LAB_00104be1;
      }
      if (currentCharacter == ']') {
        currentSymbol = 0x12f;
        goto LAB_00104be1;
      }
    }
    else {
      if (currentCharacter == '{') {
        currentSymbol = 0x131;
        goto LAB_00104be1;
      }
      if (currentCharacter == '|') {
        getCharacter();
        if (currentCharacter == '|') {
          currentSymbol = 0xc9;
          goto LAB_00104be1;
        }
        pcVar2 = "error in logic or";
        goto LAB_00104bd2;
      }
      if (currentCharacter == '}') {
        currentSymbol = 0x132;
        goto LAB_00104be1;
      }
    }
switchD_0010495a_caseD_22:
    if ((byte)(currentCharacter - 0x30U) < 10) {
      iVar1 = handleNumber();
      if (-1 < iVar1) {
        currentSymbol = 0x1f6;
        return;
      }
      goto LAB_00104c85;
    }
    if (((byte)(currentCharacter + 0xbfU) < 0x1a) ||
       (currentCharacter == '_' || (byte)(currentCharacter + 0x9fU) < 0x1a)) {
      currentSymbol = handleIdentifier();
      if (0 < currentSymbol) {
        return;
      }
      currentSymbol = 0x1f5;
      return;
    }
    if (0x2b < (byte)currentCharacter) {
      if (currentCharacter == ',') {
        currentSymbol = 0xcc;
        goto LAB_00104be1;
      }
      if (currentCharacter == ';') {
        currentSymbol = 0xcb;
        goto LAB_00104be1;
      }
      goto LAB_00104bd7;
    }
    if (currentCharacter == '\"') {
      handleStringLiteral();
      currentSymbol = 0x1f7;
      return;
    }
    if (currentCharacter == '\'') {
      iVar1 = handleCharacterLiteral();
      if (iVar1 != -1) {
        currentSymbol = 0x1f8;
        return;
      }
      goto LAB_00104c85;
    }
LAB_00104bd7:
    currentSymbol = 900;
  }
LAB_00104be1:
  getCharacter();
  return;
code_r0x00104998:
  getCharacter();
  goto LAB_001048f3;
}

Assistant:

procedure 
void getSymbol (void) {
	variable int ret;
	variable int isKeyWord;
	ret = 0;
	isKeyWord = 0;
	currentSymbol=0;
	while ((terminate == false) && (currentCharacter <= ' ')) {
		getCharacter();
	} 

	if (terminate == true )  {
		currentSymbol = SYMBOL_END;
	} elsif (currentCharacter == '&') {	
		getCharacter();
		if (currentCharacter == '&') {
			currentSymbol = SYMBOL_AND;
			getCharacter();
		} else {
			mark("error in logic and");
			currentSymbol = SYMBOL_UNKNOWN;
			getCharacter();
		}
	} elsif (currentCharacter == '|') {	
		getCharacter();
		if (currentCharacter == '|') {
			currentSymbol = SYMBOL_OR;
			getCharacter();
		} else {
			mark("error in logic or");
			currentSymbol = SYMBOL_UNKNOWN;
			getCharacter();
		}
	} elsif (currentCharacter == '*') {
		currentSymbol = SYMBOL_MUL;
		getCharacter();
	} elsif (currentCharacter == '#') {
		getCharacter();
		isKeyWord = handleIdentifier();
		if (isKeyWord == SYMBOL_INCLUDE) {
			currentSymbol = SYMBOL_HASHINCLUDE;
		} else {
			mark("bad include");
			exit(-1);	}
	} elsif (currentCharacter == '.') {
		getCharacter();
		currentSymbol = SYMBOL_DOT;
	} elsif (currentCharacter == '/') {
		currentSymbol = SYMBOL_DIV;
		getCharacter();
		if (currentCharacter == '*') {
			getCharacter();
			while (currentCharacter != '*') {
				getCharacter();
			}
			getCharacter();
			if (currentCharacter == '/') {
				getCharacter();
			} else {
				mark("bad termination of comment");
				exit(-1);
			}
			getSymbol();
		}
	} elsif (currentCharacter == '%') {
		currentSymbol = SYMBOL_MOD;
		getCharacter();
	} elsif (currentCharacter == '(') {	
		currentSymbol = SYMBOL_LPARAN;
		getCharacter();
	} elsif (currentCharacter == ')') {	
		currentSymbol = SYMBOL_RPARAN;
		getCharacter();
	} elsif (currentCharacter == ']') {
		currentSymbol = SYMBOL_RBRAK;
		getCharacter();
	} 	elsif (currentCharacter == '[') {
		currentSymbol = SYMBOL_LBRAK;
		getCharacter();
	} elsif (currentCharacter == '+') {
		currentSymbol = SYMBOL_ADD;
		getCharacter();
	} elsif (currentCharacter == '-') {
		currentSymbol = SYMBOL_SUB;
		getCharacter();
		if (currentCharacter == '>') {
			currentSymbol = SYMBOL_ARROW;
			getCharacter();
		}
	} elsif (currentCharacter == '{') {
		currentSymbol = SYMBOL_CLBRAK;
		getCharacter();
	} elsif (currentCharacter == '}') {
		currentSymbol = SYMBOL_CRBRAK;
		getCharacter();
	} elsif (currentCharacter == '=') {
		currentSymbol = SYMBOL_ASSIGN;
		getCharacter();
		if (currentCharacter == '=') {
			currentSymbol = SYMBOL_EQUALTEST;
			getCharacter();
		}
	} elsif (currentCharacter == '<') {
		currentSymbol = SYMBOL_LESS;
		getCharacter();
		if (currentCharacter == '='){
			currentSymbol = SYMBOL_LEQ;
			getCharacter();
		}
	} elsif (currentCharacter == '>') {
		currentSymbol = SYMBOL_GREATER;
		getCharacter();
		if (currentCharacter == '=') {
			currentSymbol = SYMBOL_GEQ;
			getCharacter();
		}
	} elsif (currentCharacter == '!') {
		getCharacter();
		if (currentCharacter == '=') {
			currentSymbol = SYMBOL_NOT;
			getCharacter();
		} else {
			currentSymbol = SYMBOL_UNKNOWN;
			getCharacter();
		}
	} elsif ((currentCharacter >= '0') &&  (currentCharacter <= '9')) {
		ret = handleNumber();
		if (ret < 0) {
			exit(-1);
		}
		currentSymbol = SYMBOL_NUMBER;
	} 
	elsif (((currentCharacter >= 'A') && (currentCharacter <= 'Z')) || 
		   ((currentCharacter >= 'a') && (currentCharacter <= 'z')) || (currentCharacter == '_')) {
		isKeyWord = handleIdentifier();
		if (isKeyWord > 0) {
			currentSymbol = isKeyWord;
		} else  {
			currentSymbol = SYMBOL_IDENTIFIER;
		}
	} elsif (currentCharacter == '"') {
		handleStringLiteral();
		currentSymbol=SYMBOL_STRINGLITERAL;
	} elsif (currentCharacter == ';') {
		currentSymbol = SYMBOL_SEMICOLON;
		getCharacter();
	} elsif (currentCharacter == ',') {
		currentSymbol = SYMBOL_COMMA;
		getCharacter();
	} elsif (currentCharacter == '\'') { 
		ret = handleCharacterLiteral();
		if (ret == -1) {
			exit(-1);
		}
		currentSymbol = SYMBOL_CHARACTERLITERAL;
	} else {
		currentSymbol = SYMBOL_UNKNOWN;
		getCharacter();
	}
}